

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5HashAddPoslistSize(Fts5Hash *pHash,Fts5HashEntry *p,Fts5HashEntry *p2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  Fts5HashEntry *pFVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = p->iSzPoslist;
  lVar3 = (long)(int)uVar2;
  if (lVar3 != 0) {
    pFVar4 = p2;
    if (p2 == (Fts5HashEntry *)0x0) {
      pFVar4 = p;
    }
    iVar6 = p->nData;
    if (pHash->eDetail == 1) {
      if (p->bDel != '\0') {
        *(undefined1 *)((long)&pFVar4->pHashNext + (long)iVar6) = 0;
        lVar3 = (long)iVar6 + 1;
        if (p->bContent == '\0') {
          iVar6 = (int)lVar3;
        }
        else {
          iVar6 = iVar6 + 2;
          *(undefined1 *)((long)&pFVar4->pHashNext + lVar3) = 0;
        }
      }
    }
    else {
      uVar1 = (uint)p->bDel + (~uVar2 + iVar6) * 2;
      if ((int)uVar1 < 0x80) {
        *(char *)((long)&pFVar4->pHashNext + lVar3) = (char)uVar1;
      }
      else {
        iVar5 = 2;
        if ((0x3fff < uVar1) && (iVar5 = 3, 0x1fffff < uVar1)) {
          iVar5 = 5 - (uint)(uVar1 < 0x10000000);
        }
        memmove((void *)((long)&pFVar4->pHashNext + (long)(int)(uVar2 + iVar5)),
                (void *)((long)&pFVar4->pHashNext + lVar3 + 1),(long)(int)(~uVar2 + iVar6));
        sqlite3Fts5PutVarint((uchar *)((long)&pFVar4->pHashNext + (long)p->iSzPoslist),(ulong)uVar1)
        ;
        iVar6 = iVar6 + iVar5 + -1;
      }
    }
    iVar5 = p->nData;
    if (p2 == (Fts5HashEntry *)0x0) {
      p->iSzPoslist = 0;
      p->bDel = '\0';
      p->bContent = '\0';
      p->nData = iVar6;
    }
    return iVar6 - iVar5;
  }
  return 0;
}

Assistant:

static int fts5HashAddPoslistSize(
  Fts5Hash *pHash, 
  Fts5HashEntry *p,
  Fts5HashEntry *p2
){
  int nRet = 0;
  if( p->iSzPoslist ){
    u8 *pPtr = p2 ? (u8*)p2 : (u8*)p;
    int nData = p->nData;
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      assert( nData==p->iSzPoslist );
      if( p->bDel ){
        pPtr[nData++] = 0x00;
        if( p->bContent ){
          pPtr[nData++] = 0x00;
        }
      }
    }else{
      int nSz = (nData - p->iSzPoslist - 1);       /* Size in bytes */
      int nPos = nSz*2 + p->bDel;                     /* Value of nPos field */

      assert( p->bDel==0 || p->bDel==1 );
      if( nPos<=127 ){
        pPtr[p->iSzPoslist] = (u8)nPos;
      }else{
        int nByte = sqlite3Fts5GetVarintLen((u32)nPos);
        memmove(&pPtr[p->iSzPoslist + nByte], &pPtr[p->iSzPoslist + 1], nSz);
        sqlite3Fts5PutVarint(&pPtr[p->iSzPoslist], nPos);
        nData += (nByte-1);
      }
    }

    nRet = nData - p->nData;
    if( p2==0 ){
      p->iSzPoslist = 0;
      p->bDel = 0;
      p->bContent = 0;
      p->nData = nData;
    }
  }
  return nRet;
}